

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Cycle(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint nFrames;
  Gia_Man_t *pNew;
  char *pcVar4;
  char *pcVar5;
  Abc_Cex_t *pCex;
  int iVar6;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  nFrames = 10;
  bVar1 = false;
  while( true ) {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"Fcvh"), iVar6 = globalUtilOptind, iVar3 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar3 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          if (bVar2) {
            pCex = pAbc->pCex;
          }
          else {
            pCex = (Abc_Cex_t *)0x0;
          }
          pNew = Gia_ManDupCycled(pAbc->pGia,pCex,nFrames);
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Cycle(): There is no AIG.\n";
        iVar6 = -1;
        goto LAB_00237dd4;
      }
      if (iVar3 != 99) break;
      bVar2 = (bool)(bVar2 ^ 1);
    }
    if (iVar3 != 0x46) goto LAB_00237d32;
    if (argc <= globalUtilOptind) break;
    nFrames = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if ((int)nFrames < 0) {
LAB_00237d32:
      Abc_Print(-2,"usage: &cycle [-F num] [-cvh]\n");
      Abc_Print(-2,"\t         cycles sequential circuit for the given number of timeframes\n");
      Abc_Print(-2,"\t         to derive a new initial state (which may be on the envelope)\n");
      Abc_Print(-2,"\t-F num : the number of frames to simulate [default = %d]\n",(ulong)nFrames);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar2) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using PI values from the current CEX [default = %s]\n",pcVar4)
      ;
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_00237dd4:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
  goto LAB_00237d32;
}

Assistant:

int Abc_CommandAbc9Cycle( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, nFrames = 10, fUseCex = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Fcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'c':
            fUseCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cycle(): There is no AIG.\n" );
        return 1;
    }
    pTemp = Gia_ManDupCycled( pAbc->pGia, fUseCex ? pAbc->pCex : NULL, nFrames );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cycle [-F num] [-cvh]\n" );
    Abc_Print( -2, "\t         cycles sequential circuit for the given number of timeframes\n" );
    Abc_Print( -2, "\t         to derive a new initial state (which may be on the envelope)\n" );
    Abc_Print( -2, "\t-F num : the number of frames to simulate [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-c     : toggle using PI values from the current CEX [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}